

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

bool __thiscall BinGE<5,_0,_1>::propagate(BinGE<5,_0,_1> *this)

{
  BoolView *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  Lit LVar4;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar5;
  long lVar6;
  IntVar *pIVar7;
  int64_t m_v;
  long lVar8;
  int64_t m_v_1;
  long lVar9;
  
  this_00 = &this->r;
  bVar1 = BoolView::isFalse(this_00);
  if (!bVar1) {
    pIVar7 = (this->x).var;
    lVar9 = (long)(this->x).b - (long)(pIVar7->min).v;
    lVar8 = (long)(((this->y).var)->min).v;
    if ((lVar9 < lVar8) && ((uint)(this->r).s * 2 + -1 != (int)sat.assigns.data[(uint)(this->r).v]))
    {
      if (so.lazy == true) {
        iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[8])();
        uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
        r._a = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
      }
      else {
        r._pt = (Clause *)0x0;
      }
      bVar1 = BoolView::setVal(this_00,false,(Reason)r);
      if (!bVar1) {
        return false;
      }
    }
    bVar1 = BoolView::isTrue(this_00);
    if (!bVar1) {
      return true;
    }
    pIVar7 = (this->x).var;
    lVar6 = (long)(this->x).b;
    if (lVar6 - (pIVar7->max).v < lVar8) {
      if (so.lazy == true) {
        iVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
        LVar4 = BoolView::getValLit(this_00);
        uVar5 = (ulong)(uint)LVar4.x << 0x20 | (long)iVar2 << 2 | 3;
        lVar6 = (long)(this->x).b;
        pIVar7 = (this->x).var;
      }
      else {
        uVar5 = 0;
      }
      iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar7,lVar6 - lVar8,uVar5,1);
      if ((char)iVar2 == '\0') {
        return false;
      }
    }
    pIVar7 = (this->y).var;
    lVar8 = (long)(pIVar7->max).v;
    if (lVar9 < lVar8) {
      if (so.lazy == true) {
        iVar2 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        LVar4 = BoolView::getValLit(this_00);
        uVar5 = (ulong)(uint)LVar4.x << 0x20 | (long)iVar2 << 2 | 3;
        pIVar7 = (this->y).var;
      }
      else {
        uVar5 = 0;
      }
      iVar2 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xf])(pIVar7,lVar9,uVar5,1);
      if ((char)iVar2 == '\0') {
        return false;
      }
      lVar8 = (long)(((this->y).var)->max).v;
    }
    if (lVar8 <= (long)(this->x).b - (long)(((this->x).var)->max).v) {
      Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}